

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewScopeLayer.cpp
# Opt level: O0

NewScopeLayer * __thiscall NewScopeLayer::GetVariableLayer(NewScopeLayer *this,Symbol *symbol)

{
  bool bVar1;
  runtime_error *this_00;
  bool bVar2;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  NewScopeLayer *local_20;
  NewScopeLayer *current;
  Symbol *symbol_local;
  NewScopeLayer *this_local;
  
  local_20 = this;
  current = (NewScopeLayer *)symbol;
  symbol_local = (Symbol *)this;
  while( true ) {
    bVar1 = HasVariable(local_20,(Symbol *)current);
    bVar2 = false;
    if (!bVar1) {
      bVar2 = local_20->parent_->parent_ != (NewScopeLayer *)0x0;
    }
    if (!bVar2) break;
    local_20 = local_20->parent_;
  }
  bVar2 = HasVariable(local_20,(Symbol *)current);
  if (!bVar2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    Symbol::GetName_abi_cxx11_(&local_80,(Symbol *)current);
    std::operator+(&local_60,"Variable ",&local_80);
    std::operator+(&local_40,&local_60," is not declared");
    std::runtime_error::runtime_error(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_20;
}

Assistant:

NewScopeLayer* NewScopeLayer::GetVariableLayer(const Symbol& symbol) {
  NewScopeLayer* current = this;

  while (!current->HasVariable(symbol) &&
         current->parent_->parent_ != nullptr) {
    current = current->parent_;
  }

  if (current->HasVariable(symbol)) {
    return current;
  }

  throw std::runtime_error("Variable " + symbol.GetName() + " is not declared");
}